

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImageLoaderPNG.cpp
# Opt level: O0

IImage * __thiscall irr::video::CImageLoaderPng::loadImage(CImageLoaderPng *this,IReadFile *file)

{
  bool bVar1;
  int iVar2;
  u32 uVar3;
  long lVar4;
  __jmp_buf_tag *p_Var5;
  IImage *pIVar6;
  ulong uVar7;
  long *in_RSI;
  double dVar8;
  u32 i;
  uchar *data;
  IImage *image;
  png_uint_32 h_1;
  png_uint_32 w_1;
  double image_gamma;
  double screen_gamma;
  int intent;
  png_uint_32 h;
  png_uint_32 w;
  s32 ColorType;
  s32 BitDepth;
  u32 Height;
  u32 Width;
  png_infop info_ptr;
  png_structp png_ptr;
  png_byte buffer [8];
  u8 **RowPointers;
  png_const_charp msg;
  png_structp png_ptr_00;
  dimension2d<unsigned_int> *size;
  ECOLOR_FORMAT format;
  CImage *in_stack_ffffffffffffff30;
  uint local_94;
  void *local_90;
  dimension2d<unsigned_int> local_88;
  dimension2d<unsigned_int> local_80;
  IImage *local_78;
  uint local_70;
  uint local_6c;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 local_54 [4];
  u32 local_50;
  u32 local_4c;
  int local_48;
  int local_44;
  u32 local_40;
  u32 local_3c;
  long local_38;
  long local_30;
  undefined1 local_28 [8];
  void *local_20;
  long *local_18;
  IImage *local_8;
  
  if (in_RSI == (long *)0x0) {
    local_8 = (IImage *)0x0;
  }
  else {
    local_20 = (void *)0x0;
    local_18 = in_RSI;
    lVar4 = (**(code **)*in_RSI)(in_RSI,local_28,8);
    if (lVar4 == 8) {
      iVar2 = png_sig_cmp(local_28,0,8);
      if (iVar2 == 0) {
        local_30 = png_create_read_struct("1.6.37",0,png_cpexcept_error,png_cpexcept_warn);
        if (local_30 == 0) {
          dVar8 = (double)(**(code **)(*local_18 + 0x20))();
          os::Printer::log(dVar8);
          local_8 = (IImage *)0x0;
        }
        else {
          local_38 = png_create_info_struct(local_30);
          if (local_38 == 0) {
            dVar8 = (double)(**(code **)(*local_18 + 0x20))();
            os::Printer::log(dVar8);
            png_destroy_read_struct(&local_30,0);
            local_8 = (IImage *)0x0;
          }
          else {
            p_Var5 = (__jmp_buf_tag *)png_set_longjmp_fn(local_30,longjmp,200);
            iVar2 = _setjmp(p_Var5);
            if (iVar2 == 0) {
              png_set_read_fn(local_30,local_18,user_read_data_fcn);
              png_set_sig_bytes(local_30,8);
              png_read_info(local_30,local_38);
              msg = (png_const_charp)0x0;
              png_ptr_00 = (png_structp)0x0;
              png_get_IHDR(local_30,local_38,&local_4c,&local_50,&local_44,&local_48,0,0,0);
              local_3c = local_4c;
              local_40 = local_50;
              bVar1 = checkImageDimensions(local_4c,local_50);
              if (!bVar1) {
                png_cpexcept_error(png_ptr_00,msg);
              }
              if (local_48 == 3) {
                png_set_palette_to_rgb(local_30);
              }
              if (local_44 < 8) {
                if ((local_48 == 0) || (local_48 == 4)) {
                  png_set_expand_gray_1_2_4_to_8(local_30);
                }
                else {
                  png_set_packing(local_30);
                }
              }
              iVar2 = png_get_valid(local_30,local_38,0x10);
              if (iVar2 != 0) {
                png_set_tRNS_to_alpha(local_30);
              }
              if (local_44 == 0x10) {
                png_set_strip_16(local_30);
              }
              if ((local_48 == 0) || (local_48 == 4)) {
                png_set_gray_to_rgb(local_30);
              }
              local_60 = 0x400199999999999a;
              iVar2 = png_get_sRGB(local_30,local_38,local_54);
              if (iVar2 == 0) {
                iVar2 = png_get_gAMA(local_30,local_38,&local_68);
                if (iVar2 == 0) {
                  png_set_gamma(0x400199999999999a,0x3fdd1758e219652c,local_30);
                }
                else {
                  png_set_gamma(0x400199999999999a,local_68,local_30);
                }
              }
              else {
                png_set_gamma(0x400199999999999a,0x3fdd1758e219652c,local_30);
              }
              png_read_update_info(local_30,local_38);
              size = (dimension2d<unsigned_int> *)0x0;
              format = ECF_A1R5G5B5;
              png_get_IHDR(local_30,local_38,&local_6c,&local_70,&local_44,&local_48,0);
              local_3c = local_6c;
              local_40 = local_70;
              if (local_48 == 6) {
                png_set_bgr(local_30);
              }
              local_78 = (IImage *)0x0;
              if (local_48 == 6) {
                pIVar6 = (IImage *)operator_new(0x50);
                core::dimension2d<unsigned_int>::dimension2d(&local_80,&local_3c,&local_40);
                CImage::CImage(in_stack_ffffffffffffff30,format,size);
                local_78 = pIVar6;
              }
              else {
                pIVar6 = (IImage *)operator_new(0x50);
                core::dimension2d<unsigned_int>::dimension2d(&local_88,&local_3c,&local_40);
                CImage::CImage(in_stack_ffffffffffffff30,format,size);
                local_78 = pIVar6;
              }
              if (local_78 == (IImage *)0x0) {
                dVar8 = (double)(**(code **)(*local_18 + 0x20))();
                os::Printer::log(dVar8);
                png_destroy_read_struct(&local_30,0);
                local_8 = (IImage *)0x0;
              }
              else {
                uVar7 = SUB168(ZEXT416(local_40) * ZEXT816(8),0);
                if (SUB168(ZEXT416(local_40) * ZEXT816(8),8) != 0) {
                  uVar7 = 0xffffffffffffffff;
                }
                local_20 = operator_new__(uVar7);
                if (local_20 == (void *)0x0) {
                  dVar8 = (double)(**(code **)(*local_18 + 0x20))();
                  os::Printer::log(dVar8);
                  png_destroy_read_struct(&local_30,0);
                  if (local_78 != (IImage *)0x0) {
                    (*local_78->_vptr_IImage[1])();
                  }
                  local_8 = (IImage *)0x0;
                }
                else {
                  local_90 = IImage::getData(local_78);
                  for (local_94 = 0; local_94 < local_40; local_94 = local_94 + 1) {
                    *(void **)((long)local_20 + (ulong)local_94 * 8) = local_90;
                    uVar3 = IImage::getPitch(local_78);
                    local_90 = (void *)((long)local_90 + (ulong)uVar3);
                  }
                  p_Var5 = (__jmp_buf_tag *)png_set_longjmp_fn(local_30,longjmp,200);
                  iVar2 = _setjmp(p_Var5);
                  if (iVar2 == 0) {
                    png_read_image(local_30,local_20);
                    png_read_end(local_30,0);
                    if (local_20 != (void *)0x0) {
                      operator_delete__(local_20);
                    }
                    png_destroy_read_struct(&local_30,&local_38,0);
                    local_8 = local_78;
                  }
                  else {
                    png_destroy_read_struct(&local_30,&local_38,0);
                    if (local_20 != (void *)0x0) {
                      operator_delete__(local_20);
                    }
                    if (local_78 != (IImage *)0x0) {
                      (*local_78->_vptr_IImage[1])();
                    }
                    local_8 = (IImage *)0x0;
                  }
                }
              }
            }
            else {
              png_destroy_read_struct(&local_30,&local_38,0);
              if (local_20 != (void *)0x0) {
                operator_delete__(local_20);
              }
              local_8 = (IImage *)0x0;
            }
          }
        }
      }
      else {
        dVar8 = (double)(**(code **)(*local_18 + 0x20))();
        os::Printer::log(dVar8);
        local_8 = (IImage *)0x0;
      }
    }
    else {
      dVar8 = (double)(**(code **)(*local_18 + 0x20))();
      os::Printer::log(dVar8);
      local_8 = (IImage *)0x0;
    }
  }
  return local_8;
}

Assistant:

IImage *CImageLoaderPng::loadImage(io::IReadFile *file) const
{
	if (!file)
		return 0;

	// Used to point to image rows
	u8 **RowPointers = 0;

	png_byte buffer[8];
	// Read the first few bytes of the PNG file
	if (file->read(buffer, 8) != 8) {
		os::Printer::log("LOAD PNG: can't read file (filesize < 8)", file->getFileName(), ELL_ERROR);
		return 0;
	}

	// Check if it really is a PNG file
	if (png_sig_cmp(buffer, 0, 8)) {
		os::Printer::log("LOAD PNG: not really a png (wrong signature)", file->getFileName(), ELL_ERROR);
		return 0;
	}

	// Allocate the png read struct
	png_structp png_ptr = png_create_read_struct(PNG_LIBPNG_VER_STRING,
			NULL, (png_error_ptr)png_cpexcept_error, (png_error_ptr)png_cpexcept_warn);
	if (!png_ptr) {
		os::Printer::log("LOAD PNG: Internal PNG create read struct failure", file->getFileName(), ELL_ERROR);
		return 0;
	}

	// Allocate the png info struct
	png_infop info_ptr = png_create_info_struct(png_ptr);
	if (!info_ptr) {
		os::Printer::log("LOAD PNG: Internal PNG create info struct failure", file->getFileName(), ELL_ERROR);
		png_destroy_read_struct(&png_ptr, NULL, NULL);
		return 0;
	}

	// for proper error handling
	if (setjmp(png_jmpbuf(png_ptr))) {
		png_destroy_read_struct(&png_ptr, &info_ptr, NULL);
		delete[] RowPointers;
		return 0;
	}

	// changed by zola so we don't need to have public FILE pointers
	png_set_read_fn(png_ptr, file, user_read_data_fcn);

	png_set_sig_bytes(png_ptr, 8); // Tell png that we read the signature

	png_read_info(png_ptr, info_ptr); // Read the info section of the png file

	u32 Width;
	u32 Height;
	s32 BitDepth;
	s32 ColorType;
	{
		// Use temporary variables to avoid passing cast pointers
		png_uint_32 w, h;
		// Extract info
		png_get_IHDR(png_ptr, info_ptr,
				&w, &h,
				&BitDepth, &ColorType, NULL, NULL, NULL);
		Width = w;
		Height = h;
	}

	if (!checkImageDimensions(Width, Height))
		png_cpexcept_error(png_ptr, "Unreasonable size");

	// Convert palette color to true color
	if (ColorType == PNG_COLOR_TYPE_PALETTE)
		png_set_palette_to_rgb(png_ptr);

	// Convert low bit colors to 8 bit colors
	if (BitDepth < 8) {
		if (ColorType == PNG_COLOR_TYPE_GRAY || ColorType == PNG_COLOR_TYPE_GRAY_ALPHA)
			png_set_expand_gray_1_2_4_to_8(png_ptr);
		else
			png_set_packing(png_ptr);
	}

	if (png_get_valid(png_ptr, info_ptr, PNG_INFO_tRNS))
		png_set_tRNS_to_alpha(png_ptr);

	// Convert high bit colors to 8 bit colors
	if (BitDepth == 16)
		png_set_strip_16(png_ptr);

	// Convert gray color to true color
	if (ColorType == PNG_COLOR_TYPE_GRAY || ColorType == PNG_COLOR_TYPE_GRAY_ALPHA)
		png_set_gray_to_rgb(png_ptr);

	int intent;
	const double screen_gamma = 2.2;

	if (png_get_sRGB(png_ptr, info_ptr, &intent))
		png_set_gamma(png_ptr, screen_gamma, 0.45455);
	else {
		double image_gamma;
		if (png_get_gAMA(png_ptr, info_ptr, &image_gamma))
			png_set_gamma(png_ptr, screen_gamma, image_gamma);
		else
			png_set_gamma(png_ptr, screen_gamma, 0.45455);
	}

	// Update the changes in between, as we need to get the new color type
	// for proper processing of the RGBA type
	png_read_update_info(png_ptr, info_ptr);
	{
		// Use temporary variables to avoid passing cast pointers
		png_uint_32 w, h;
		// Extract info
		png_get_IHDR(png_ptr, info_ptr,
				&w, &h,
				&BitDepth, &ColorType, NULL, NULL, NULL);
		Width = w;
		Height = h;
	}

	// Convert RGBA to BGRA
	if (ColorType == PNG_COLOR_TYPE_RGB_ALPHA) {
#ifdef __BIG_ENDIAN__
		png_set_swap_alpha(png_ptr);
#else
		png_set_bgr(png_ptr);
#endif
	}

	// Create the image structure to be filled by png data
	video::IImage *image = 0;
	if (ColorType == PNG_COLOR_TYPE_RGB_ALPHA)
		image = new CImage(ECF_A8R8G8B8, core::dimension2d<u32>(Width, Height));
	else
		image = new CImage(ECF_R8G8B8, core::dimension2d<u32>(Width, Height));
	if (!image) {
		os::Printer::log("LOAD PNG: Internal PNG create image struct failure", file->getFileName(), ELL_ERROR);
		png_destroy_read_struct(&png_ptr, NULL, NULL);
		return 0;
	}

	// Create array of pointers to rows in image data
	RowPointers = new png_bytep[Height];
	if (!RowPointers) {
		os::Printer::log("LOAD PNG: Internal PNG create row pointers failure", file->getFileName(), ELL_ERROR);
		png_destroy_read_struct(&png_ptr, NULL, NULL);
		delete image;
		return 0;
	}

	// Fill array of pointers to rows in image data
	unsigned char *data = (unsigned char *)image->getData();
	for (u32 i = 0; i < Height; ++i) {
		RowPointers[i] = data;
		data += image->getPitch();
	}

	// for proper error handling
	if (setjmp(png_jmpbuf(png_ptr))) {
		png_destroy_read_struct(&png_ptr, &info_ptr, NULL);
		delete[] RowPointers;
		delete image;
		return 0;
	}

	// Read data using the library function that handles all transformations including interlacing
	png_read_image(png_ptr, RowPointers);

	png_read_end(png_ptr, NULL);
	delete[] RowPointers;
	png_destroy_read_struct(&png_ptr, &info_ptr, 0); // Clean up memory

	return image;
}